

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDynamicStateTestCaseUtil.hpp
# Opt level: O2

TestInstance * __thiscall
vkt::DynamicState::
InstanceFactory<vkt::DynamicState::(anonymous_namespace)::LineWidthParamTestInstance>::
createInstance(InstanceFactory<vkt::DynamicState::(anonymous_namespace)::LineWidthParamTestInstance>
               *this,Context *context)

{
  char *vertexShaderName;
  DynamicStateBaseClass *this_00;
  mapped_type *ppcVar1;
  VkPhysicalDeviceFeatures *pVVar2;
  NotSupportedError *this_01;
  RGBA local_9c;
  Vec4 local_98;
  string local_88;
  Vec4 local_68;
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  local_58;
  
  this_00 = (DynamicStateBaseClass *)operator_new(0x1a8);
  std::
  _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
  ::_Rb_tree(&local_58,&(this->m_shaderPaths)._M_t);
  local_88._M_dataplus._M_p._0_4_ = 0;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_58,(key_type *)&local_88);
  vertexShaderName = *ppcVar1;
  local_98.m_data[0] = 1.4013e-45;
  ppcVar1 = std::
            map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
            ::operator[]((map<glu::ShaderType,_const_char_*,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
                          *)&local_58,(key_type *)&local_98);
  DynamicStateBaseClass::DynamicStateBaseClass(this_00,context,vertexShaderName,*ppcVar1);
  (this_00->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__DynamicStateBaseClass_00bd6288;
  pVVar2 = Context::getDeviceFeatures((this_00->super_TestInstance).m_context);
  if (pVVar2->wideLines != 0) {
    this_00->m_topology = VK_PRIMITIVE_TOPOLOGY_LINE_LIST;
    local_98.m_data[0] = -1.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 1.0;
    local_9c.m_value = 0xff00ff00;
    tcu::RGBA::toVec(&local_9c);
    PositionColorVertex::PositionColorVertex((PositionColorVertex *)&local_88,&local_98,&local_68);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>
              (&this_00->m_data,(PositionColorVertex *)&local_88);
    local_98.m_data[0] = 1.0;
    local_98.m_data[1] = 0.0;
    local_98.m_data[2] = 0.0;
    local_98.m_data[3] = 1.0;
    local_9c.m_value = 0xff00ff00;
    tcu::RGBA::toVec(&local_9c);
    PositionColorVertex::PositionColorVertex((PositionColorVertex *)&local_88,&local_98,&local_68);
    std::
    vector<vkt::DynamicState::PositionColorVertex,_std::allocator<vkt::DynamicState::PositionColorVertex>_>
    ::emplace_back<vkt::DynamicState::PositionColorVertex>
              (&this_00->m_data,(PositionColorVertex *)&local_88);
    DynamicStateBaseClass::initialize(this_00);
    std::
    _Rb_tree<glu::ShaderType,_std::pair<const_glu::ShaderType,_const_char_*>,_std::_Select1st<std::pair<const_glu::ShaderType,_const_char_*>_>,_std::less<glu::ShaderType>,_std::allocator<std::pair<const_glu::ShaderType,_const_char_*>_>_>
    ::~_Rb_tree(&local_58);
    return &this_00->super_TestInstance;
  }
  this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_88,"Line width test is unsupported",(allocator<char> *)&local_98);
  tcu::NotSupportedError::NotSupportedError(this_01,&local_88);
  __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestInstance* createInstance (Context& context) const
	{
		return new Instance(context, m_shaderPaths);
	}